

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::invalid_option_format_error::~invalid_option_format_error
          (invalid_option_format_error *this)

{
  void *in_RDI;
  
  ~invalid_option_format_error((invalid_option_format_error *)0x139f08);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

invalid_option_format_error(const std::string& format)
                : OptionSpecException(u8"Invalid option format " + LQUOTE + format + RQUOTE)
        {
        }